

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STP_Feature.cpp
# Opt level: O1

bool __thiscall sch::s_STN_VVR::operator==(s_STN_VVR *this,s_STN_VVR *vvr)

{
  bool bVar1;
  
  if ((((1e-07 <= ABS((this->m_axis).m_x - (vvr->m_axis).m_x)) ||
       (1e-07 <= ABS((this->m_axis).m_y - (vvr->m_axis).m_y))) ||
      (1e-07 <= ABS((this->m_axis).m_z - (vvr->m_axis).m_z))) ||
     (bVar1 = true, 1e-07 <= ABS(this->m_cosangle - vvr->m_cosangle))) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool s_STN_VVR::operator==(const s_STN_VVR & vvr) const
{
  Scalar epsilon = 1e-7;

  if((fabs(m_axis[0] - vvr.m_axis[0]) < epsilon) && (fabs(m_axis[1] - vvr.m_axis[1]) < epsilon)
     && (fabs(m_axis[2] - vvr.m_axis[2]) < epsilon) && (fabs(m_cosangle - vvr.m_cosangle) < epsilon))
    return true;
  else
    return false;
}